

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spake25519.cc
# Opt level: O2

int SPAKE2_generate_msg(SPAKE2_CTX *ctx,uint8_t *out,size_t *out_len,size_t max_out_len,
                       uint8_t *password,size_t password_len)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint i;
  int iVar5;
  long lVar6;
  byte bVar7;
  uint8_t *precomp_table;
  scalar password_scalar;
  uint8_t private_tmp [64];
  uint8_t password_tmp [64];
  ge_cached mask_cached;
  ge_p3 mask;
  ge_p3 P;
  ge_p2 Pstar_proj;
  ge_p1p1 Pstar;
  
  iVar5 = 0;
  if ((0x1f < max_out_len) && (ctx->state == spake2_state_init)) {
    RAND_bytes(private_tmp,0x40);
    x25519_sc_reduce(private_tmp);
    bVar7 = 0;
    for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 1) {
      bVar1 = private_tmp[lVar6];
      private_tmp[lVar6] = bVar1 << 3 | bVar7;
      bVar7 = bVar1 >> 5;
    }
    *(undefined8 *)(ctx->private_key + 0x10) = private_tmp._16_8_;
    *(undefined8 *)(ctx->private_key + 0x18) = private_tmp._24_8_;
    *(undefined8 *)ctx->private_key = private_tmp._0_8_;
    *(undefined8 *)(ctx->private_key + 8) = private_tmp._8_8_;
    x25519_ge_scalarmult_base(&P,ctx->private_key);
    SHA512(password,password_len,password_tmp);
    *(undefined8 *)ctx->password_hash = password_tmp._0_8_;
    *(undefined8 *)(ctx->password_hash + 8) = password_tmp._8_8_;
    *(undefined8 *)(ctx->password_hash + 0x10) = password_tmp._16_8_;
    *(undefined8 *)(ctx->password_hash + 0x18) = password_tmp._24_8_;
    *(undefined8 *)(ctx->password_hash + 0x20) = password_tmp._32_8_;
    *(undefined8 *)(ctx->password_hash + 0x28) = password_tmp._40_8_;
    *(undefined8 *)(ctx->password_hash + 0x30) = password_tmp._48_8_;
    *(undefined8 *)(ctx->password_hash + 0x38) = password_tmp._56_8_;
    x25519_sc_reduce(password_tmp);
    password_scalar.words[2]._0_1_ = password_tmp[0x10];
    password_scalar.words[2]._1_1_ = password_tmp[0x11];
    password_scalar.words[2]._2_1_ = password_tmp[0x12];
    password_scalar.words[2]._3_1_ = password_tmp[0x13];
    password_scalar.words[2]._4_1_ = password_tmp[0x14];
    password_scalar.words[2]._5_1_ = password_tmp[0x15];
    password_scalar.words[2]._6_1_ = password_tmp[0x16];
    password_scalar.words[2]._7_1_ = password_tmp[0x17];
    password_scalar.words[3]._0_1_ = password_tmp[0x18];
    password_scalar.words[3]._1_1_ = password_tmp[0x19];
    password_scalar.words[3]._2_1_ = password_tmp[0x1a];
    password_scalar.words[3]._3_1_ = password_tmp[0x1b];
    password_scalar.words[3]._4_1_ = password_tmp[0x1c];
    password_scalar.words[3]._5_1_ = password_tmp[0x1d];
    password_scalar.words[3]._6_1_ = password_tmp[0x1e];
    password_scalar.words[3]._7_1_ = password_tmp[0x1f];
    password_scalar.words[0]._0_1_ = password_tmp[0];
    password_scalar.words[0]._1_1_ = password_tmp[1];
    password_scalar.words[0]._2_1_ = password_tmp[2];
    password_scalar.words[0]._3_1_ = password_tmp[3];
    password_scalar.words[0]._4_1_ = password_tmp[4];
    password_scalar.words[0]._5_1_ = password_tmp[5];
    password_scalar.words[0]._6_1_ = password_tmp[6];
    password_scalar.words[0]._7_1_ = password_tmp[7];
    password_scalar.words[1]._0_1_ = password_tmp[8];
    password_scalar.words[1]._1_1_ = password_tmp[9];
    password_scalar.words[1]._2_1_ = password_tmp[10];
    password_scalar.words[1]._3_1_ = password_tmp[0xb];
    password_scalar.words[1]._4_1_ = password_tmp[0xc];
    password_scalar.words[1]._5_1_ = password_tmp[0xd];
    password_scalar.words[1]._6_1_ = password_tmp[0xe];
    password_scalar.words[1]._7_1_ = password_tmp[0xf];
    if (ctx->disable_password_scalar_hack == '\0') {
      mask.X.v[2] = 0;
      mask.X.v[3] = 0x1000000000000000;
      mask.X.v[0] = 0x5812631a5cf5d3ed;
      mask.X.v[1] = 0x14def9dea2f79cd6;
      mask_cached.YplusX.v[2] = 0;
      mask_cached.YplusX.v[3] = 0;
      mask_cached.YplusX.v[0] = 0;
      mask_cached.YplusX.v[1] = 0;
      scalar_cmov((scalar *)&mask_cached,(scalar *)&mask,-(ulong)((uint)password_tmp._0_8_ & 1));
      scalar_add(&password_scalar,(scalar *)&mask_cached);
      scalar_double((scalar *)&mask);
      mask_cached.YplusX.v[2] = 0;
      mask_cached.YplusX.v[3] = 0;
      mask_cached.YplusX.v[0] = 0;
      mask_cached.YplusX.v[1] = 0;
      scalar_cmov((scalar *)&mask_cached,(scalar *)&mask,
                  (long)((ulong)(~(uint)password_scalar.words[0] & 2) - 1) >> 0x3f);
      scalar_add(&password_scalar,(scalar *)&mask_cached);
      scalar_double((scalar *)&mask);
      mask_cached.YplusX.v[2] = 0;
      mask_cached.YplusX.v[3] = 0;
      mask_cached.YplusX.v[0] = 0;
      mask_cached.YplusX.v[1] = 0;
      scalar_cmov((scalar *)&mask_cached,(scalar *)&mask,
                  (long)((ulong)(~(uint)password_scalar.words[0] & 4) - 1) >> 0x3f);
      scalar_add(&password_scalar,(scalar *)&mask_cached);
      if ((password_scalar.words[0] & 7) != 0) {
        __assert_fail("(password_scalar.words[0] & 7) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/curve25519/spake25519.cc"
                      ,0x1a5,
                      "int SPAKE2_generate_msg(SPAKE2_CTX *, uint8_t *, size_t *, size_t, const uint8_t *, size_t)"
                     );
      }
    }
    *(BN_ULONG *)(ctx->password_scalar + 0x10) = password_scalar.words[2];
    *(BN_ULONG *)(ctx->password_scalar + 0x18) = password_scalar.words[3];
    *(BN_ULONG *)ctx->password_scalar = password_scalar.words[0];
    *(BN_ULONG *)(ctx->password_scalar + 8) = password_scalar.words[1];
    precomp_table = kSpakeNSmallPrecomp;
    if (ctx->my_role == spake2_role_alice) {
      precomp_table = kSpakeMSmallPrecomp;
    }
    x25519_ge_scalarmult_small_precomp(&mask,ctx->password_scalar,precomp_table);
    x25519_ge_p3_to_cached(&mask_cached,&mask);
    x25519_ge_add(&Pstar,&P,&mask_cached);
    x25519_ge_p1p1_to_p2(&Pstar_proj,&Pstar);
    x25519_ge_tobytes(ctx->my_msg,&Pstar_proj);
    uVar2 = *(undefined8 *)ctx->my_msg;
    uVar3 = *(undefined8 *)(ctx->my_msg + 8);
    uVar4 = *(undefined8 *)(ctx->my_msg + 0x18);
    *(undefined8 *)(out + 0x10) = *(undefined8 *)(ctx->my_msg + 0x10);
    *(undefined8 *)(out + 0x18) = uVar4;
    *(undefined8 *)out = uVar2;
    *(undefined8 *)(out + 8) = uVar3;
    *out_len = 0x20;
    ctx->state = spake2_state_msg_generated;
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int SPAKE2_generate_msg(SPAKE2_CTX *ctx, uint8_t *out, size_t *out_len,
                        size_t max_out_len, const uint8_t *password,
                        size_t password_len) {
  if (ctx->state != spake2_state_init) {
    return 0;
  }

  if (max_out_len < sizeof(ctx->my_msg)) {
    return 0;
  }

  uint8_t private_tmp[64];
  RAND_bytes(private_tmp, sizeof(private_tmp));
  x25519_sc_reduce(private_tmp);
  // Multiply by the cofactor (eight) so that we'll clear it when operating on
  // the peer's point later in the protocol.
  left_shift_3(private_tmp);
  OPENSSL_memcpy(ctx->private_key, private_tmp, sizeof(ctx->private_key));

  ge_p3 P;
  x25519_ge_scalarmult_base(&P, ctx->private_key);

  // mask = h(password) * <N or M>.
  uint8_t password_tmp[SHA512_DIGEST_LENGTH];
  SHA512(password, password_len, password_tmp);
  OPENSSL_memcpy(ctx->password_hash, password_tmp, sizeof(ctx->password_hash));
  x25519_sc_reduce(password_tmp);

  // Due to a copy-paste error, the call to |left_shift_3| was omitted after
  // the |x25519_sc_reduce|, just above. This meant that |ctx->password_scalar|
  // was not a multiple of eight to clear the cofactor and thus three bits of
  // the password hash would leak. In order to fix this in a unilateral way,
  // points of small order are added to the mask point such that it is in the
  // prime-order subgroup. Since the ephemeral scalar is a multiple of eight,
  // these points will cancel out when calculating the shared secret.
  //
  // Adding points of small order is the same as adding multiples of the prime
  // order to the password scalar. Since that's faster, that is what is done
  // below. The prime order (kOrder) is a large prime, thus odd, thus the LSB
  // is one. So adding it will flip the LSB. Adding twice it will flip the next
  // bit and so one for all the bottom three bits.

  scalar password_scalar;
  OPENSSL_memcpy(&password_scalar, password_tmp, sizeof(password_scalar));

  // |password_scalar| is the result of |x25519_sc_reduce| and thus is, at
  // most, $l-1$ (where $l$ is |kOrder|, the order of the prime-order subgroup
  // of Ed25519). In the following, we may add $l + 2×l + 4×l$ for a max value
  // of $8×l-1$. That is < 2**256, as required.

  if (!ctx->disable_password_scalar_hack) {
    scalar order = kOrder;
    scalar tmp;

    OPENSSL_memset(&tmp, 0, sizeof(tmp));
    scalar_cmov(&tmp, &order,
                constant_time_eq_w(password_scalar.words[0] & 1, 1));
    scalar_add(&password_scalar, &tmp);

    scalar_double(&order);
    OPENSSL_memset(&tmp, 0, sizeof(tmp));
    scalar_cmov(&tmp, &order,
                constant_time_eq_w(password_scalar.words[0] & 2, 2));
    scalar_add(&password_scalar, &tmp);

    scalar_double(&order);
    OPENSSL_memset(&tmp, 0, sizeof(tmp));
    scalar_cmov(&tmp, &order,
                constant_time_eq_w(password_scalar.words[0] & 4, 4));
    scalar_add(&password_scalar, &tmp);

    assert((password_scalar.words[0] & 7) == 0);
  }

  OPENSSL_memcpy(ctx->password_scalar, password_scalar.words,
                 sizeof(ctx->password_scalar));

  ge_p3 mask;
  x25519_ge_scalarmult_small_precomp(&mask, ctx->password_scalar,
                                     ctx->my_role == spake2_role_alice
                                         ? kSpakeMSmallPrecomp
                                         : kSpakeNSmallPrecomp);

  // P* = P + mask.
  ge_cached mask_cached;
  x25519_ge_p3_to_cached(&mask_cached, &mask);
  ge_p1p1 Pstar;
  x25519_ge_add(&Pstar, &P, &mask_cached);

  // Encode P*
  ge_p2 Pstar_proj;
  x25519_ge_p1p1_to_p2(&Pstar_proj, &Pstar);
  x25519_ge_tobytes(ctx->my_msg, &Pstar_proj);

  OPENSSL_memcpy(out, ctx->my_msg, sizeof(ctx->my_msg));
  *out_len = sizeof(ctx->my_msg);
  ctx->state = spake2_state_msg_generated;

  return 1;
}